

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialPort.h
# Opt level: O0

void __thiscall SerialPort::~SerialPort(SerialPort *this)

{
  SerialPort *this_local;
  
  this->_vptr_SerialPort = (_func_int **)&PTR__SerialPort_00128d30;
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

virtual ~SerialPort() {}